

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O1

int dumb_it_trim_silent_patterns(DUH *duh)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  DUMB_IT_SIGDATA *pDVar6;
  uint uVar7;
  uint uVar8;
  IT_PATTERN *pIVar9;
  long lVar10;
  
  iVar4 = -1;
  if ((((duh != (DUH *)0x0) && (pDVar6 = duh_get_it_sigdata(duh), pDVar6 != (DUMB_IT_SIGDATA *)0x0))
      && (pDVar6->order != (uchar *)0x0)) && (pDVar6->pattern != (IT_PATTERN *)0x0)) {
    if (pDVar6->n_orders < 1) {
      lVar10 = 0;
    }
    else {
      lVar10 = 0;
      do {
        if ((int)(uint)pDVar6->order[lVar10] < pDVar6->n_patterns) {
          pIVar9 = pDVar6->pattern + pDVar6->order[lVar10];
          iVar2 = is_pattern_silent(pIVar9,(int)lVar10);
          bVar1 = true;
          if (1 < iVar2) {
            pIVar9->n_rows = 1;
            pIVar9->n_entries = 0;
            bVar1 = false;
            if (pIVar9->entry != (IT_ENTRY *)0x0) {
              free(pIVar9->entry);
              pIVar9->entry = (IT_ENTRY *)0x0;
            }
          }
          if (1 < iVar2) goto LAB_006ecac2;
        }
        else {
LAB_006ecac2:
          bVar1 = false;
        }
      } while ((!bVar1) && (lVar10 = lVar10 + 1, lVar10 < pDVar6->n_orders));
    }
    uVar7 = pDVar6->n_orders;
    if ((uint)lVar10 != uVar7) {
      uVar3 = (int)uVar7 >> 0x1f & uVar7;
      uVar8 = uVar7;
      do {
        uVar7 = uVar7 - 1;
        uVar5 = uVar3;
        if ((int)uVar8 < 1) break;
        if ((int)(uint)pDVar6->order[uVar7] < pDVar6->n_patterns) {
          pIVar9 = pDVar6->pattern + pDVar6->order[uVar7];
          iVar4 = is_pattern_silent(pIVar9,uVar8 - 1);
          iVar2 = 5;
          if (1 < iVar4) {
            pIVar9->n_rows = 1;
            pIVar9->n_entries = 0;
            iVar2 = 0;
            if (pIVar9->entry != (IT_ENTRY *)0x0) {
              free(pIVar9->entry);
              pIVar9->entry = (IT_ENTRY *)0x0;
            }
          }
          if (1 < iVar4) goto LAB_006ecb5e;
        }
        else {
LAB_006ecb5e:
          iVar2 = 0;
        }
        uVar5 = uVar8;
        uVar8 = uVar8 - 1;
      } while (iVar2 == 0);
      iVar4 = -(uint)((int)uVar5 < 1);
    }
  }
  return iVar4;
}

Assistant:

int DUMBEXPORT dumb_it_trim_silent_patterns(DUH * duh) {
	int n;
	DUMB_IT_SIGDATA *sigdata;

	if (!duh) return -1;

	sigdata = duh_get_it_sigdata(duh);

	if (!sigdata || !sigdata->order || !sigdata->pattern) return -1;

	for (n = 0; n < sigdata->n_orders; n++) {
		int p = sigdata->order[n];
		if (p < sigdata->n_patterns) {
			IT_PATTERN * pattern = &sigdata->pattern[p];
			if (is_pattern_silent(pattern, n) > 1) {
				pattern->n_rows = 1;
				pattern->n_entries = 0;
				if (pattern->entry)
				{
					free(pattern->entry);
					pattern->entry = NULL;
				}
			} else
				break;
		}
	}

	if (n == sigdata->n_orders) return -1;

	for (n = sigdata->n_orders - 1; n >= 0; n--) {
		int p = sigdata->order[n];
		if (p < sigdata->n_patterns) {
			IT_PATTERN * pattern = &sigdata->pattern[p];
			if (is_pattern_silent(pattern, n) > 1) {
				pattern->n_rows = 1;
				pattern->n_entries = 0;
				if (pattern->entry)
				{
					free(pattern->entry);
					pattern->entry = NULL;
				}
			} else
				break;
		}
	}

	if (n < 0) return -1;

	/*duh->length = dumb_it_build_checkpoints(sigdata, 0);*/

	return 0;
}